

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilzo.c
# Opt level: O2

lzo_uint32 lzo_adler32(lzo_uint32 adler,uchar *buf,lzo_uint len)

{
  byte bVar1;
  ulong uVar2;
  lzo_uint32 lVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  
  if (buf == (uchar *)0x0) {
    lVar3 = 1;
  }
  else {
    uVar4 = (ulong)(adler >> 0x10);
    uVar14 = adler & 0xffff;
    for (; len != 0; len = len - uVar2) {
      uVar2 = 0x15b0;
      if (len < 0x15b0) {
        uVar2 = len;
      }
      uVar6 = uVar2 & 0xffffffff;
      iVar7 = (int)uVar2;
      if (len < 0x10) goto LAB_0012d537;
      do {
        iVar15 = *buf + uVar14;
        iVar7 = (uint)buf[1] + iVar15;
        iVar16 = (uint)buf[2] + iVar7;
        iVar8 = (uint)buf[3] + iVar16;
        iVar17 = (uint)buf[4] + iVar8;
        iVar9 = (uint)buf[5] + iVar17;
        iVar18 = (uint)buf[6] + iVar9;
        iVar10 = (uint)buf[7] + iVar18;
        iVar19 = (uint)buf[8] + iVar10;
        iVar11 = (uint)buf[9] + iVar19;
        iVar20 = (uint)buf[10] + iVar11;
        iVar12 = (uint)buf[0xb] + iVar20;
        iVar21 = (uint)buf[0xc] + iVar12;
        iVar13 = (uint)buf[0xd] + iVar21;
        iVar22 = (uint)buf[0xe] + iVar13;
        uVar14 = (uint)buf[0xf] + iVar22;
        uVar4 = (ulong)((int)uVar4 + iVar15 + iVar7 + iVar16 + iVar8 + iVar17 + iVar9 + iVar18 +
                        iVar10 + iVar19 + iVar11 + iVar20 + iVar12 + iVar21 + iVar13 + iVar22 +
                       uVar14);
        buf = buf + 0x10;
        uVar5 = (int)uVar6 - 0x10;
        uVar6 = (ulong)uVar5;
      } while (0xf < uVar5);
      while (iVar7 = (int)uVar6, uVar5 != 0) {
LAB_0012d537:
        bVar1 = *buf;
        buf = buf + 1;
        uVar14 = uVar14 + bVar1;
        uVar4 = (ulong)((int)uVar4 + uVar14);
        uVar5 = iVar7 - 1;
        uVar6 = (ulong)uVar5;
      }
      uVar14 = uVar14 % 0xfff1;
      uVar4 = uVar4 % 0xfff1;
    }
    lVar3 = (int)uVar4 << 0x10 | uVar14;
  }
  return lVar3;
}

Assistant:

LZO_PUBLIC(lzo_uint32)
lzo_adler32(lzo_uint32 adler, const lzo_bytep buf, lzo_uint len)
{
    lzo_uint32 s1 = adler & 0xffff;
    lzo_uint32 s2 = (adler >> 16) & 0xffff;
    unsigned k;

    if (buf == NULL)
        return 1;

    while (len > 0)
    {
        k = len < LZO_NMAX ? (unsigned) len : LZO_NMAX;
        len -= k;
        if (k >= 16) do
        {
            LZO_DO16(buf,0);
            buf += 16;
            k -= 16;
        } while (k >= 16);
        if (k != 0) do
        {
            s1 += *buf++;
            s2 += s1;
        } while (--k > 0);
        s1 %= LZO_BASE;
        s2 %= LZO_BASE;
    }
    return (s2 << 16) | s1;
}